

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilnam.cpp
# Opt level: O1

int __thiscall
CVmObjFileName::equals(CVmObjFileName *this,vm_obj_id_t self,vm_val_t *val,int param_3)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  uint uVar4;
  ushort *puVar5;
  char *pcVar6;
  long *in_FS_OFFSET;
  err_frame_t err_cur__;
  uint local_100 [2];
  long local_f8;
  void *local_f0;
  __jmp_buf_tag local_e8;
  
  if ((val->typ == VM_OBJ) &&
     (iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[(val->val).obj >> 0xc]
                                     [(val->val).obj & 0xfff].ptr_ + 8))
                        (G_obj_table_X.pages_[(val->val).obj >> 0xc] + ((val->val).obj & 0xfff),
                         metaclass_reg_), iVar3 != 0)) {
    pcVar6 = (G_obj_table_X.pages_[(val->val).obj >> 0xc]->ptr_).obj_ +
             ((val->val).obj & 0xfff) * 0x18;
  }
  else {
    pcVar6 = (char *)0x0;
  }
  if (pcVar6 == (char *)0x0) {
    puVar5 = (ushort *)vm_val_t::get_as_string(val);
    if (puVar5 == (ushort *)0x0) {
      iVar3 = 0;
    }
    else {
      G_err_frame::__tls_init();
      local_f8 = *in_FS_OFFSET;
      G_err_frame::__tls_init();
      *in_FS_OFFSET = (long)local_100;
      local_100[0] = _setjmp(&local_e8);
      if (local_100[0] == 0) {
        pcVar6 = lib_copy_str((char *)(puVar5 + 1),(ulong)*puVar5);
        uVar4 = fn_file_names_equal((this->super_CVmObject).ext_ + 8,pcVar6);
        this = (CVmObjFileName *)(ulong)uVar4;
      }
      else {
        pcVar6 = (char *)0x0;
      }
      if (-1 < (short)local_100[0]) {
        local_100[0] = local_100[0] | 0x8000;
        lib_free_str(pcVar6);
      }
      lVar1 = local_f8;
      G_err_frame::__tls_init();
      *in_FS_OFFSET = lVar1;
      if ((local_100[0] & 0x4001) != 0) {
        G_err_frame::__tls_init();
        if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
          G_err_frame::__tls_init();
          free(*(void **)(*in_FS_OFFSET + 0x10));
        }
        pvVar2 = local_f0;
        G_err_frame::__tls_init();
        *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
        err_rethrow();
      }
      if ((local_100[0] & 2) != 0) {
        free(local_f0);
      }
      iVar3 = (int)this;
    }
  }
  else {
    iVar3 = fn_file_names_equal((this->super_CVmObject).ext_ + 8,(char *)(*(long *)(pcVar6 + 8) + 8)
                               );
  }
  return iVar3;
}

Assistant:

int CVmObjFileName::equals(VMG_ vm_obj_id_t self, const vm_val_t *val,
                           int /*depth*/) const
{
    /* check the type of the other value */
    CVmObjFileName *fn;
    const char *str;
    if ((fn = vm_val_cast(CVmObjFileName, val)) != 0)
    {
        /* it's another FileName object - compare its path */
        return fn_file_names_equal(
            vmg_ get_ext()->get_str(), fn->get_ext()->get_str());
    }
    else if ((str = val->get_as_string(vmg0_)) != 0)
    {
        char *strz = 0;
        int eq;
        err_try
        {
            /* make a null-terminated copy of the other name */
            strz = lib_copy_str(str + VMB_LEN, vmb_get_len(str));
            
            /* compare the names */
            eq = fn_file_names_equal(vmg_ get_ext()->get_str(), strz);
        }
        err_finally
        {
            lib_free_str(strz);
        }